

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Scc_Apu.cpp
# Opt level: O2

void __thiscall Scc_Apu::run_until(Scc_Apu *this,blip_time_t end_time)

{
  byte bVar1;
  uchar uVar2;
  Blip_Buffer *buf;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  osc_t *poVar10;
  ulong uVar11;
  int iVar12;
  int local_68;
  
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    buf = this->oscs[lVar8].output;
    if (buf != (Blip_Buffer *)0x0) {
      buf->modified_ = 1;
      iVar12 = (*(byte *)((long)(this->synth).impulses + lVar8 * 2 + -0x3b) & 0xf) * 0x100;
      bVar1 = (byte)(this->synth).impulses[lVar8 + -0x1e];
      uVar9 = iVar12 + (uint)bVar1;
      local_68 = 0;
      if (((this->regs[0x8f] >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
         ((int)buf->clock_rate_ + 0x80000U >> 0x12 <= uVar9)) {
        local_68 = (*(byte *)((long)(this->synth).impulses + lVar8 + -0x32) & 0xf) << 3;
      }
      poVar10 = this->oscs + lVar8;
      lVar3 = lVar8 * 0x20 + 0x7c;
      lVar6 = (ulong)(lVar8 != 4) * 0x20;
      iVar4 = (char)this->regs[(long)poVar10->phase + lVar6 + lVar3 + -0x9c] * local_68;
      iVar7 = this->last_time;
      iVar5 = iVar4 - poVar10->last_amp;
      if (iVar5 != 0) {
        poVar10->last_amp = iVar4;
        Blip_Synth<8,_1>::offset(&this->synth,iVar7,iVar5,buf);
        iVar7 = this->last_time;
      }
      iVar7 = iVar7 + poVar10->delay;
      if (iVar7 < end_time) {
        iVar12 = iVar12 + (uint)bVar1 + 1;
        if (local_68 == 0) {
          iVar4 = (int)((uVar9 + end_time) - iVar7) / iVar12;
          poVar10->phase = poVar10->phase + iVar4 & 0x1f;
          iVar7 = iVar7 + iVar4 * iVar12;
        }
        else {
          lVar3 = lVar6 + lVar3 + -0x20;
          uVar11 = (ulong)poVar10->phase;
          iVar4 = (int)(char)this->regs[uVar11 + lVar3 + -0x7c];
          do {
            uVar9 = (int)uVar11 + 1U & 0x1f;
            uVar11 = (ulong)uVar9;
            uVar2 = this->regs[uVar11 + lVar3 + -0x7c];
            iVar5 = (char)uVar2 - iVar4;
            if (iVar5 != 0) {
              Blip_Synth<8,_1>::offset(&this->synth,iVar7,iVar5 * local_68,buf);
              iVar4 = (int)(char)uVar2;
            }
            iVar7 = iVar7 + iVar12;
          } while (iVar7 < end_time);
          poVar10->phase = uVar9;
          poVar10->last_amp = local_68 * (char)this->regs[uVar11 + lVar3 + -0x7c];
        }
      }
      poVar10->delay = iVar7 - end_time;
    }
  }
  this->last_time = end_time;
  return;
}

Assistant:

void Scc_Apu::run_until( blip_time_t end_time )
{
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t& osc = oscs [index];
		
		Blip_Buffer* const output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_time_t period = (regs [0x80 + index * 2 + 1] & 0x0F) * 0x100 +
				regs [0x80 + index * 2] + 1;
		int volume = 0;
		if ( regs [0x8F] & (1 << index) )
		{
			blip_time_t inaudible_period = (blargg_ulong) (output->clock_rate() +
					inaudible_freq * 32) / (inaudible_freq * 16);
			if ( period > inaudible_period )
				volume = (regs [0x8A + index] & 0x0F) * (amp_range / 256 / 15);
		}
		
		BOOST::int8_t const* wave = (BOOST::int8_t*) regs + index * wave_size;
		if ( index == osc_count - 1 )
			wave -= wave_size; // last two oscs share wave
		{
			int amp = wave [osc.phase] * volume;
			int delta = amp - osc.last_amp;
			if ( delta )
			{
				osc.last_amp = amp;
				synth.offset( last_time, delta, output );
			}
		}
		
		blip_time_t time = last_time + osc.delay;
		if ( time < end_time )
		{
			if ( !volume )
			{
				// maintain phase
				blargg_long count = (end_time - time + period - 1) / period;
				osc.phase = (osc.phase + count) & (wave_size - 1);
				time += count * period;
			}
			else
			{
				
				int phase = osc.phase;
				int last_wave = wave [phase];
				phase = (phase + 1) & (wave_size - 1); // pre-advance for optimal inner loop
				
				do
				{
					int amp = wave [phase];
					phase = (phase + 1) & (wave_size - 1);
					int delta = amp - last_wave;
					if ( delta )
					{
						last_wave = amp;
						synth.offset( time, delta * volume, output );
					}
					time += period;
				}
				while ( time < end_time );
				
				osc.phase = phase = (phase - 1) & (wave_size - 1); // undo pre-advance
				osc.last_amp = wave [phase] * volume;
			}
		}
		osc.delay = time - end_time;
	}
	last_time = end_time;
}